

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall
QTreeView::setFirstColumnSpanned(QTreeView *this,int row,QModelIndex *parent,bool span)

{
  long lVar1;
  QAbstractItemModel *pQVar2;
  bool bVar3;
  int iVar4;
  QTreeViewPrivate *this_00;
  reference pQVar5;
  byte in_CL;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long in_FS_OFFSET;
  int i;
  QTreeViewPrivate *d;
  QModelIndex index;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  QAbstractItemViewPrivate *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  QPersistentModelIndex local_40 [3];
  QPersistentModelIndex in_stack_ffffffffffffffd8;
  QTreeViewPrivate *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTreeView *)0x8efefc);
  if ((this_00->super_QAbstractItemViewPrivate).model != (QAbstractItemModel *)0x0) {
    this_01 = (QTreeViewPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = (this_00->super_QAbstractItemViewPrivate).model;
    (**(code **)(*(long *)pQVar2 + 0x60))(&stack0xffffffffffffffe0,pQVar2,in_ESI,0,in_RDX);
    bVar3 = QModelIndex::isValid((QModelIndex *)in_stack_ffffffffffffff80);
    if (bVar3) {
      if ((in_CL & 1) == 0) {
        in_stack_ffffffffffffff80 = (QAbstractItemViewPrivate *)&this_00->spanningIndexes;
        QPersistentModelIndex::QPersistentModelIndex
                  (local_40,(QModelIndex *)&stack0xffffffffffffffe0);
        QSet<QPersistentModelIndex>::remove
                  ((QSet<QPersistentModelIndex> *)in_stack_ffffffffffffff80,(char *)local_40);
        QPersistentModelIndex::~QPersistentModelIndex(local_40);
      }
      else {
        QPersistentModelIndex::QPersistentModelIndex
                  ((QPersistentModelIndex *)&stack0xffffffffffffffd8,
                   (QModelIndex *)&stack0xffffffffffffffe0);
        QSet<QPersistentModelIndex>::insert
                  ((QSet<QPersistentModelIndex> *)this_00,
                   (QPersistentModelIndex *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        QPersistentModelIndex::~QPersistentModelIndex
                  ((QPersistentModelIndex *)&stack0xffffffffffffffd8);
      }
      QAbstractItemViewPrivate::executePostedLayout(in_stack_ffffffffffffff80);
      iVar4 = QTreeViewPrivate::viewIndex(this_01,(QModelIndex *)in_stack_ffffffffffffffd8.d);
      if (-1 < iVar4) {
        in_stack_ffffffffffffff7c = (uint)(in_CL & 1);
        pQVar5 = QList<QTreeViewItem>::operator[]
                           ((QList<QTreeViewItem> *)in_stack_ffffffffffffff80,
                            (ulong)(CONCAT14(in_CL,in_stack_ffffffffffffff78) & 0x1ffffffff));
        *(ulong *)&pQVar5->field_0x1c =
             *(ulong *)&pQVar5->field_0x1c & 0xfffffffffffffffd |
             ((ulong)in_stack_ffffffffffffff7c & 1) << 1;
      }
      QWidget::update((QWidget *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::setFirstColumnSpanned(int row, const QModelIndex &parent, bool span)
{
    Q_D(QTreeView);
    if (!d->model)
        return;
    const QModelIndex index = d->model->index(row, 0, parent);
    if (!index.isValid())
        return;

    if (span)
        d->spanningIndexes.insert(index);
    else
        d->spanningIndexes.remove(index);

    d->executePostedLayout();
    int i = d->viewIndex(index);
    if (i >= 0)
        d->viewItems[i].spanning = span;

    d->viewport->update();
}